

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O3

void TranslateModuleTypePrototypes(ExpressionTranslateContext *ctx)

{
  uint uVar1;
  TypeBase *type;
  ExpressionContext *pEVar2;
  TypeClass *typeClass;
  ulong uVar3;
  
  PrintIndentedLine(ctx,"// Type prototypes");
  pEVar2 = ctx->ctx;
  if ((pEVar2->types).count != 0) {
    uVar3 = 0;
    do {
      type = (pEVar2->types).data[uVar3];
      if ((type->isGeneric == false) && (uVar1 = type->typeID, uVar1 < 0x1a)) {
        if ((0x2130000U >> (uVar1 & 0x1f) & 1) == 0) {
          if (uVar1 != 0x13) {
            if ((uVar1 != 0x18) ||
               ((type->importModule != (ModuleData *)0x0 &&
                (*(char *)((long)&type[3]._vptr_TypeBase + 1) != '\0')))) goto LAB_00158ab9;
            goto LAB_00158a7f;
          }
          Print(ctx,"struct ");
          PrintEscapedName(ctx,type->name);
        }
        else {
LAB_00158a7f:
          Print(ctx,"struct ");
          PrintEscapedTypeName(ctx,type);
        }
        Print(ctx,";");
        OutputContext::Print(ctx->output,"\n",1);
      }
LAB_00158ab9:
      uVar3 = uVar3 + 1;
      pEVar2 = ctx->ctx;
    } while (uVar3 < (pEVar2->types).count);
  }
  OutputContext::Print(ctx->output,"\n",1);
  return;
}

Assistant:

void TranslateModuleTypePrototypes(ExpressionTranslateContext &ctx)
{
	PrintIndentedLine(ctx, "// Type prototypes");

	for(unsigned i = 0; i < ctx.ctx.types.size(); i++)
	{
		TypeBase *type = ctx.ctx.types[i];

		if(type->isGeneric)
			continue;

		if(TypeStruct *typeStruct = getType<TypeStruct>(type))
		{
			if(TypeClass *typeClass = getType<TypeClass>(type))
			{
				if(typeClass->importModule && typeClass->isInternal)
					continue;
			}

			Print(ctx, "struct ");
			PrintEscapedTypeName(ctx, typeStruct);
			Print(ctx, ";");
			PrintLine(ctx);
		}
		else if(TypeArray *typeArray = getType<TypeArray>(type))
		{
			Print(ctx, "struct ");
			PrintEscapedName(ctx, typeArray->name);
			Print(ctx, ";");
			PrintLine(ctx);
		}
	}

	PrintLine(ctx);
}